

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Storage.hpp
# Opt level: O2

void __thiscall
MOS::MOS6522::MOS6522<Apple::II::Mockingboard::AYVIA>::shift_out
          (MOS6522<Apple::II::Mockingboard::AYVIA> *this)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  
  bVar4 = (this->super_MOS6522Storage).registers_.auxiliary_control & 0x1c;
  iVar3 = (this->super_MOS6522Storage).shift_bits_remaining_;
  if (bVar4 == 0x10 || iVar3 != 0) {
    bVar2 = (this->super_MOS6522Storage).registers_.shift;
    bVar5 = bVar2 >> 7;
    if (bVar4 != 0x10) {
      bVar5 = 0;
    }
    (this->super_MOS6522Storage).registers_.shift = bVar5 | bVar2 * '\x02';
    iVar3 = iVar3 + -1;
    (this->super_MOS6522Storage).shift_bits_remaining_ = iVar3;
    if (iVar3 == 0) {
      puVar1 = &(this->super_MOS6522Storage).registers_.interrupt_flags;
      *puVar1 = *puVar1 | 4;
      reevaluate_interrupts(this);
      return;
    }
  }
  return;
}

Assistant:

ShiftMode shift_mode() const {
			return ShiftMode((registers_.auxiliary_control >> 2) & 7);
		}